

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O0

SUNErrCode
SUNMemoryHelper_Copy
          (SUNMemoryHelper helper,SUNMemory dst,SUNMemory src,size_t memory_size,void *queue)

{
  SUNErrCode SVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  SUNContext sunctx_local_scope_;
  SUNErrCode ier;
  
  SVar1 = (**(code **)(*(long *)(in_RDI + 8) + 0x10))
                    (in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9,*(undefined8 *)(in_RDI + 0x10));
  return SVar1;
}

Assistant:

SUNErrCode SUNMemoryHelper_Copy(SUNMemoryHelper helper, SUNMemory dst,
                                SUNMemory src, size_t memory_size, void* queue)
{
  SUNErrCode ier = SUN_SUCCESS;
  SUNFunctionBegin(helper->sunctx);
  SUNAssert(helper->ops->copy, SUN_ERR_NOT_IMPLEMENTED);
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(helper));
  ier = helper->ops->copy(helper, dst, src, memory_size, queue);
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(helper));
  return ier;
}